

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.h
# Opt level: O0

string * __thiscall
cmExportTryCompileFileGenerator::GetCxxModulesDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this)

{
  cmExportTryCompileFileGenerator *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCxxModulesDirectory() const override { return {}; }